

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

void __thiscall
Js::ProbeContainer::UpdateFramePointers
          (ProbeContainer *this,bool fMatchWithCurrentScriptContext,
          DWORD_PTR dispatchHaltFrameAddress)

{
  anon_class_56_7_cb203164 walkFrame;
  uint uVar1;
  int iVar2;
  ReferencedArenaAdapter *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *pSVar4;
  DiagStackFrame *local_1a0;
  undefined1 *local_198;
  JavascriptStackWalker *pJStack_190;
  long local_188;
  Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> **ppSStack_180;
  ProbeContainer *local_178;
  ArenaAllocator **ppAStack_170;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **local_168;
  undefined1 local_159;
  code *pcStack_158;
  bool isLibraryFrameEnabledDebugger;
  undefined8 local_150;
  TrackAllocData local_138;
  Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *local_110;
  DiagStack *tempFramePointers;
  JavascriptStackWalker walker;
  TrackAllocData local_50;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_28;
  ArenaAllocator *pDiagArena;
  DWORD_PTR dispatchHaltFrameAddress_local;
  ProbeContainer *pPStack_10;
  bool fMatchWithCurrentScriptContext_local;
  ProbeContainer *this_local;
  
  pDiagArena = (ArenaAllocator *)dispatchHaltFrameAddress;
  dispatchHaltFrameAddress_local._7_1_ = fMatchWithCurrentScriptContext;
  pPStack_10 = this;
  this_00 = DebugManager::GetDiagnosticArena(this->debugManager);
  pAVar3 = &Memory::ReferencedArenaAdapter::Arena(this_00)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  local_28 = pAVar3;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,
             (type_info *)
             &JsUtil::Stack<Js::DiagStackFrame*,Memory::ArenaAllocator,false,DefaultComparer>::
              typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
             ,0x67);
  pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar3,&local_50);
  walker.currentFrame.stackCheckCodeHeight = (size_t)Memory::ArenaAllocator::Alloc;
  pSVar4 = (Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *)
           new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)pAVar3,0x3f67b0);
  JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Stack
            (pSVar4,(ArenaAllocator *)local_28);
  this->framePointers = pSVar4;
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)&tempFramePointers,this->pScriptContext,
             (bool)(~dispatchHaltFrameAddress_local._7_1_ & 1),(PVOID)0x0,true);
  pAVar3 = local_28;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_138,
             (type_info *)
             &JsUtil::Stack<Js::DiagStackFrame*,Memory::ArenaAllocator,false,DefaultComparer>::
              typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
             ,0x6a);
  pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar3,&local_138);
  pcStack_158 = Memory::ArenaAllocator::Alloc;
  local_150 = 0;
  pSVar4 = (Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *)
           new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)pAVar3,0x3f67b0);
  JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Stack
            (pSVar4,(ArenaAllocator *)local_28);
  local_110 = pSVar4;
  local_159 = IsLibraryStackFrameSupportEnabled(this);
  local_198 = &local_159;
  pJStack_190 = (JavascriptStackWalker *)&tempFramePointers;
  local_188 = (long)&dispatchHaltFrameAddress_local + 7;
  ppSStack_180 = &local_110;
  ppAStack_170 = &pDiagArena;
  local_168 = &local_28;
  walkFrame.walker = pJStack_190;
  walkFrame.isLibraryFrameEnabledDebugger = (bool *)local_198;
  walkFrame.fMatchWithCurrentScriptContext = (bool *)local_188;
  walkFrame.tempFramePointers = ppSStack_180;
  walkFrame.this = this;
  walkFrame.dispatchHaltFrameAddress = (DWORD_PTR *)ppAStack_170;
  walkFrame.pDiagArena = (ArenaAllocator **)local_168;
  local_178 = this;
  JavascriptStackWalker::WalkUntil<Js::ProbeContainer::UpdateFramePointers(bool,unsigned_long)::__0>
            (pJStack_190,walkFrame,false,false);
  uVar1 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Count
                    (local_110);
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::UpdateFramePointers: detected %d frames (this=%p, fMatchWithCurrentScriptContext=%d)\n"
                ,(ulong)uVar1,this,(ulong)(dispatchHaltFrameAddress_local._7_1_ & 1));
  while( true ) {
    iVar2 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
            Count(local_110);
    if (iVar2 == 0) break;
    pSVar4 = this->framePointers;
    local_1a0 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>
                ::Pop(local_110);
    JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Push
              (pSVar4,&local_1a0);
  }
  JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)&tempFramePointers);
  return;
}

Assistant:

void ProbeContainer::UpdateFramePointers(bool fMatchWithCurrentScriptContext, DWORD_PTR dispatchHaltFrameAddress)
    {
        ArenaAllocator* pDiagArena = debugManager->GetDiagnosticArena()->Arena();
        framePointers = Anew(pDiagArena, DiagStack, pDiagArena);

        JavascriptStackWalker walker(pScriptContext, !fMatchWithCurrentScriptContext, nullptr/*returnAddress*/, true/*forceFullWalk*/);
        DiagStack* tempFramePointers = Anew(pDiagArena, DiagStack, pDiagArena);
        const bool isLibraryFrameEnabledDebugger = IsLibraryStackFrameSupportEnabled();

        walker.WalkUntil([&](JavascriptFunction* func, ushort frameIndex) -> bool
        {
            if (isLibraryFrameEnabledDebugger || !func->IsLibraryCode())
            {
                DiagStackFrame* frm = nullptr;
                InterpreterStackFrame *interpreterFrame = walker.GetCurrentInterpreterFrame();
                ScriptContext* frameScriptContext = walker.GetCurrentScriptContext();
                Assert(frameScriptContext);

                if (!fMatchWithCurrentScriptContext && !frameScriptContext->IsScriptContextInDebugMode() && tempFramePointers->Count() == 0)
                {
                    // this means the top frame is not in the debug mode. We shouldn't be stopping for this break.
                    // This could happen if the exception happens on the diagnosticsScriptEngine.
                    return true;
                }

                // Ignore frames which are not in debug mode, which can happen when diag engine calls into user engine under debugger
                // -- topmost frame is under debugger but some frames could be in non-debug mode as they are from diag engine.
                if (frameScriptContext->IsScriptContextInDebugMode() &&
                    (!fMatchWithCurrentScriptContext || frameScriptContext == pScriptContext))
                {
                    if (interpreterFrame)
                    {
                        if (dispatchHaltFrameAddress == 0 || interpreterFrame->GetStackAddress() > dispatchHaltFrameAddress)
                        {
                            frm = Anew(pDiagArena, DiagInterpreterStackFrame, interpreterFrame);
                        }
                    }
                    else
                    {
                        void* stackAddress = walker.GetCurrentArgv();
                        if (dispatchHaltFrameAddress == 0 || reinterpret_cast<DWORD_PTR>(stackAddress) > dispatchHaltFrameAddress)
                        {
#if ENABLE_NATIVE_CODEGEN
                            if (func->IsScriptFunction())
                            {
                                frm = Anew(pDiagArena, DiagNativeStackFrame,
                                    VarTo<ScriptFunction>(walker.GetCurrentFunction()), walker.GetByteCodeOffset(), stackAddress, walker.GetCurrentCodeAddr());
                            }
                            else
#else
                            Assert(!func->IsScriptFunction());
#endif
                            {
                                frm = Anew(pDiagArena, DiagRuntimeStackFrame, func, walker.GetCurrentNativeLibraryEntryName(), stackAddress);
                            }
                        }
                    }
                }

                if (frm)
                {
                    tempFramePointers->Push(frm);
                }
            }

            return false;
        });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::UpdateFramePointers: detected %d frames (this=%p, fMatchWithCurrentScriptContext=%d)\n"),
            tempFramePointers->Count(), this, fMatchWithCurrentScriptContext);

        while (tempFramePointers->Count())
        {
            framePointers->Push(tempFramePointers->Pop());
        }
    }